

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

void __thiscall
jsonrpccxx::JsonRpcException::JsonRpcException(JsonRpcException *this,JsonRpcException *param_1)

{
  JsonRpcException *param_1_local;
  JsonRpcException *this_local;
  
  std::exception::exception(&this->super_exception,&param_1->super_exception);
  *(undefined ***)this = &PTR__JsonRpcException_00240800;
  this->code = param_1->code;
  std::__cxx11::string::string((string *)&this->message,(string *)&param_1->message);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->data,&param_1->data);
  std::__cxx11::string::string((string *)&this->err,(string *)&param_1->err);
  return;
}

Assistant:

JsonRpcException(int code, const std::string &message, const json &data) noexcept
        : code(code), message(message), data(data), err(std::to_string(code) + ": " + message + ", data: " + data.dump()) {}